

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml2.cpp
# Opt level: O2

void __thiscall tinyxml2::XMLPrinter::PushAttribute(XMLPrinter *this,char *name,char *value)

{
  Putc(this,' ');
  Write(this,name);
  Write(this,"=\"");
  PrintString(this,value,false);
  Putc(this,'\"');
  return;
}

Assistant:

void XMLPrinter::PushAttribute(const char* name, const char* value)
{
    TIXMLASSERT(_elementJustOpened);
    Putc(' ');
    Write(name);
    Write("=\"");
    PrintString(value, false);
    Putc('\"');
}